

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_parser.cpp
# Opt level: O3

void __thiscall BmsParser::Parser::ParseHeaderValue(Parser *this,char *str)

{
  string *value;
  string *key;
  char cVar1;
  bool bVar2;
  int iVar3;
  BmsRegistArraySet *pBVar4;
  Iterator IVar5;
  Iterator IVar6;
  BmsHeaderTable *this_00;
  map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_> *this_01;
  mapped_type *pmVar7;
  char *pcVar8;
  char *__nptr;
  BmsWord pos;
  BmsWord local_5c;
  pointer local_58;
  string local_50;
  
  value = &this->value_;
  pcVar8 = (char *)(this->value_)._M_string_length;
  strlen(str);
  std::__cxx11::string::_M_replace((ulong)value,0,pcVar8,(ulong)str);
  key = &this->key_;
  iVar3 = std::__cxx11::string::compare((char *)key);
  if (iVar3 == 0) {
    std::__cxx11::string::_M_replace((ulong)key,0,(char *)(this->key_)._M_string_length,0x13828d);
  }
  pBVar4 = BmsBms::GetRegistArraySet(this->bms_);
  IVar5 = BmsRegistArraySet::Begin_abi_cxx11_(pBVar4);
  while( true ) {
    pBVar4 = BmsBms::GetRegistArraySet(this->bms_);
    IVar6 = BmsRegistArraySet::End_abi_cxx11_(pBVar4);
    if (IVar5._M_node == IVar6._M_node) break;
    bVar2 = BmsRegistArray::CheckConstruction((string *)(IVar5._M_node + 1),key);
    if (bVar2) {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)key);
      BmsWord::BmsWord(&local_5c,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      BmsRegistArray::Set(*(BmsRegistArray **)(IVar5._M_node + 2),&local_5c,value);
      BmsWord::~BmsWord(&local_5c);
      return;
    }
    IVar5._M_node = (_Base_ptr)std::_Rb_tree_increment(IVar5._M_node);
  }
  iVar3 = std::__cxx11::string::compare((char *)key);
  if (iVar3 != 0) {
    this_00 = BmsBms::GetHeaders(this->bms_);
    BmsHeaderTable::Set(this_00,key,value);
    return;
  }
  pcVar8 = str;
  if (str != (char *)0x0) {
    for (; cVar1 = *pcVar8, cVar1 != '\0'; pcVar8 = pcVar8 + 1) {
      __nptr = pcVar8;
      if ((cVar1 == ' ') || (cVar1 == '\t')) goto LAB_00133255;
    }
  }
LAB_0013326f:
  WriteLogLine(this,"%d line - Failed to parse #STP (%s)",(ulong)(uint)this->line_,str);
  return;
LAB_00133255:
  while (cVar1 != '\0') {
    if ((cVar1 == '\t') || (cVar1 == ' ')) {
      local_58 = (pointer)atof(pcVar8);
      iVar3 = atoi(__nptr);
      this_01 = &BmsBms::GetSTPManager(this->bms_)->stp_;
      local_50._M_dataplus._M_p = local_58;
      pmVar7 = std::
               map<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>::
               operator[](this_01,(key_type_conflict *)&local_50);
      *pmVar7 = *pmVar7 + iVar3;
      return;
    }
    cVar1 = __nptr[1];
    __nptr = __nptr + 1;
  }
  goto LAB_0013326f;
}

Assistant:

void Parser::ParseHeaderValue(const char* str)
	{
		// regist value or metadata(header) value
		value_.assign(str);
		// #EXBPM behaves same as #BPM
		if (key_ == "EXBPM") key_ = "BPM";
		for (auto it = bms_.GetRegistArraySet().Begin(); it != bms_.GetRegistArraySet().End(); ++it) {
			if (BmsRegistArray::CheckConstruction(it->first, key_)) {
				BmsWord pos(key_.substr(key_.length() - 2));
				it->second->Set(pos, value_);
				return;
			}
		}
		// if proper regist array hadn't found
		// then add to header
		if (key_ == "STP") {
			const char* measure_s_ = ParseSeparator(str);
			const char* time_s_ = ParseSeparator(measure_s_);
			if (!measure_s_ || !time_s_) {
				WriteLogLine("%d line - Failed to parse #STP (%s)", line_, str);
				return;
			}
			double  measure_ = atof(measure_s_);
			int time_ = atoi(time_s_);
			bms_.GetSTPManager().Add(measure_, time_);
		}
		else {
			bms_.GetHeaders().Set(key_, value_);
		}
	}